

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pgraph_class_celsius.cc
# Opt level: O1

void __thiscall hwtest::pgraph::MthdCelsiusXfrm3::emulate_mthd(MthdCelsiusXfrm3 *this)

{
  long lVar1;
  
  if (((this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.celsius_config_c & 0x100) ==
      0) {
    if ((((this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.nsource & 2) == 0) &&
       ((this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.celsius_pipe_junk
        [*(int *)&(this->super_SingleMthdTest).super_MthdTest.field_0x25914] =
             (this->super_SingleMthdTest).super_MthdTest.val,
       *(int *)&(this->super_SingleMthdTest).super_MthdTest.field_0x25914 == 2)) {
      lVar1 = 0x3ae2;
      do {
        *(undefined4 *)((long)this + (long)this->which * 0x10 + -0x6b8 + lVar1 * 4) =
             *(undefined4 *)
              ((long)(this->super_SingleMthdTest).super_MthdTest.super_StateTest.super_RepeatTest.
                     super_Test.rnd._M_x + lVar1 * 4 + -8);
        lVar1 = lVar1 + 1;
      } while (lVar1 != 0x3ae6);
    }
    return;
  }
  MthdTest::warn((MthdTest *)this,4);
  return;
}

Assistant:

void emulate_mthd() override {
		uint32_t err = 0;
		if (extr(exp.celsius_config_c, 8, 1))
			err |= 4;
		if (err) {
			warn(err);
		} else {
			if (!extr(exp.nsource, 1, 1)) {
				exp.celsius_pipe_junk[idx] = val;
				if (idx == 2) {
					for (int i = 0; i < 4; i++)
						exp.celsius_pipe_xfrm[which][i] = exp.celsius_pipe_junk[i];
				}
			}
		}
	}